

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

size_type __thiscall wabt::string_view::find_first_of(string_view *this,string_view s,size_type pos)

{
  unsigned_long *puVar1;
  const_iterator pcVar2;
  char *pcVar3;
  const_iterator __first2;
  const_iterator __last2;
  size_type local_60;
  const_iterator iter;
  size_type pos_local;
  string_view *this_local;
  string_view s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (string_view *)s.data_;
  iter = (const_iterator)pos;
  pos_local = (size_type)this;
  puVar1 = std::min<unsigned_long>((unsigned_long *)&iter,&this->size_);
  iter = (const_iterator)*puVar1;
  pcVar2 = begin(this);
  pcVar3 = pcVar2 + (long)iter;
  pcVar2 = end(this);
  __first2 = begin((string_view *)&this_local);
  __last2 = end((string_view *)&this_local);
  pcVar3 = std::find_first_of<char_const*,char_const*>(pcVar3,pcVar2,__first2,__last2);
  pcVar2 = end(this);
  if (pcVar3 == pcVar2) {
    local_60 = 0xffffffffffffffff;
  }
  else {
    pcVar2 = begin(this);
    local_60 = (long)pcVar3 - (long)pcVar2;
  }
  return local_60;
}

Assistant:

string_view::size_type string_view::find_first_of(string_view s,
                                                  size_type pos) const
    noexcept {
  pos = std::min(pos, size_);
  const_iterator iter =
      std::find_first_of(begin() + pos, end(), s.begin(), s.end());
  return iter == end() ? npos : iter - begin();
}